

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
::ReadUInt(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
           *this,uint ub)

{
  uint uVar1;
  uint in_ESI;
  BinaryReaderBase *in_RDI;
  CStringRef unaff_retaddr;
  uint unsigned_value;
  int value;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  
  uVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                    ((BinaryReader<mp::internal::IdentityConverter> *)
                     in_stack_ffffffffffffffe0.data_);
  if (in_ESI <= uVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"integer {} out of bounds");
    BinaryReaderBase::ReportError<int>(in_RDI,unaff_retaddr,(int *)CONCAT44(in_ESI,uVar1));
  }
  return uVar1;
}

Assistant:

int ReadUInt(unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }